

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cencode.c
# Opt level: O3

void rcnb_encode_short(unsigned_short value_in,wchar_t **value_out)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  ulong uVar3;
  uint uVar4;
  undefined2 in_register_0000003a;
  ulong uVar5;
  
  uVar4 = value_in & 0x7fff;
  pwVar2 = *value_out;
  uVar5 = (ulong)(CONCAT22(in_register_0000003a,value_in) >> 0xf);
  uVar3 = (ulong)(-1 < (short)value_in);
  pwVar2[uVar5 * 2] = L"rRŔŕŖŗŘřƦȐȑȒȓɌɍ"[(ulong)uVar4 / 0x8ca];
  pwVar2[uVar5 * 2 + 1] = L"cCĆćĈĉĊċČčƇƈÇȻȼ"[((ulong)uVar4 % 0x8ca) / 0x96];
  pwVar2[uVar5 * 2 + uVar3 * 4 + -2] =
       L"nNŃńŅņŇňƝƞÑǸǹȠȵ"[(ushort)((uVar4 % 0x96) / 10)];
  wVar1 = L"bBƀƁƃƄƅßÞþ"[(ushort)(uVar4 % 10)];
  *value_out = pwVar2 + uVar5 * 2 + uVar3 * 4;
  pwVar2[uVar5 * 2 + uVar3 * 4 + -1] = wVar1;
  if ((short)value_in < 0) {
    *value_out = pwVar2 + uVar5 * 2 + uVar3 * 4 + 2;
  }
  return;
}

Assistant:

void rcnb_encode_short(unsigned short value_in, wchar_t** value_out)
{
    bool reverse = false;
    if (value_in > 0x7FFF) {
        reverse = true;
        value_in = (unsigned short)(value_in & 0x7FFF);
    }
    if (reverse)
        *value_out += 2;
    *(*value_out)++ = cr[value_in / scnb];
    *(*value_out)++ = cc[value_in % scnb / snb];
    if (reverse)
        *value_out -= 4;
    *(*value_out)++ = cn[value_in % snb / sb];
    *(*value_out)++ = cb[value_in % sb];
    if (reverse)
        *value_out += 2;
}